

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O1

shared_ptr<evp_pkey_st> __thiscall
jwt::helper::load_private_key_from_string(helper *this,string *key,string *password)

{
  int len;
  int iVar1;
  BIO_METHOD *type;
  BIO *b;
  EVP_PKEY *pEVar2;
  runtime_error *prVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<evp_pkey_st> sVar5;
  
  type = BIO_s_mem();
  b = BIO_new(type);
  len = (int)key->_M_string_length;
  iVar1 = BIO_write(b,(key->_M_dataplus)._M_p,len);
  if (iVar1 != len) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"failed to load private key: bio_write failed");
    *(undefined ***)prVar3 = &PTR__runtime_error_00113bd8;
    __cxa_throw(prVar3,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  pEVar2 = PEM_read_bio_PrivateKey
                     (b,(EVP_PKEY **)0x0,(undefined1 *)0x0,(password->_M_dataplus)._M_p);
  *(EVP_PKEY **)this = pEVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<evp_pkey_st*,void(*)(evp_pkey_st*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),pEVar2,EVP_PKEY_free);
  if (*(long *)this != 0) {
    _Var4._M_pi = extraout_RDX;
    if (b != (BIO *)0x0) {
      BIO_free_all(b);
      _Var4._M_pi = extraout_RDX_00;
    }
    sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var4._M_pi;
    sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<evp_pkey_st>)
           sVar5.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (prVar3,"failed to load private key: PEM_read_bio_PrivateKey failed");
  *(undefined ***)prVar3 = &PTR__runtime_error_00113bd8;
  __cxa_throw(prVar3,&rsa_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
		std::shared_ptr<EVP_PKEY> load_private_key_from_string(const std::string& key, const std::string& password = "") {
			std::unique_ptr<BIO, decltype(&BIO_free_all)> privkey_bio(BIO_new(BIO_s_mem()), BIO_free_all);
			const int len = static_cast<int>(key.size());
			if (BIO_write(privkey_bio.get(), key.data(), len) != len)
				throw rsa_exception("failed to load private key: bio_write failed");
			std::shared_ptr<EVP_PKEY> pkey(PEM_read_bio_PrivateKey(privkey_bio.get(), nullptr, nullptr, const_cast<char*>(password.c_str())), EVP_PKEY_free);
			if (!pkey)
				throw rsa_exception("failed to load private key: PEM_read_bio_PrivateKey failed");
			return pkey;
		}